

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int32_suite::fail_array64_int32_invalid_length(void)

{
  undefined4 local_5c;
  value local_58 [2];
  undefined1 local_50 [8];
  decoder decoder;
  value_type input [17];
  
  decoder.current.view._M_str = (uchar *)0xfdc;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[17]>
            ((decoder *)local_50,(uchar (*) [17])&decoder.current.view._M_str);
  local_58[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_50);
  local_5c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa1b,"void compact_int32_suite::fail_array64_int32_invalid_length()",local_58,
             &local_5c);
  return;
}

Assistant:

void fail_array64_int32_invalid_length()
{
    const value_type input[] = { token::code::array64_int32, 0x0F, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}